

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O0

void * cuddLevelQueueEnqueue(DdLevelQueue *queue,void *key,int level)

{
  int iVar1;
  bool bVar2;
  DdLevelQueue *local_30;
  DdQueueItem *item;
  int plevel;
  int level_local;
  void *key_local;
  DdLevelQueue *queue_local;
  
  queue_local = (DdLevelQueue *)hashLookup(queue,key);
  if (queue_local == (DdLevelQueue *)0x0) {
    if (queue->freelist == (DdQueueItem *)0x0) {
      local_30 = (DdLevelQueue *)malloc((long)queue->itemsize);
      if (local_30 == (DdLevelQueue *)0x0) {
        return (void *)0x0;
      }
    }
    else {
      local_30 = (DdLevelQueue *)queue->freelist;
      queue->freelist = (DdQueueItem *)local_30->first;
    }
    memset(local_30,0,(long)queue->itemsize);
    local_30->freelist = (DdQueueItem *)key;
    queue->size = queue->size + 1;
    item._0_4_ = level;
    if (queue->last[level] == (DdQueueItem *)0x0) {
      while( true ) {
        bVar2 = false;
        if ((int)item != 0) {
          bVar2 = queue->last[(int)item] == (DdQueueItem *)0x0;
        }
        if (!bVar2) break;
        item._0_4_ = (int)item + -1;
      }
      if (queue->last[(int)item] == (DdQueueItem *)0x0) {
        local_30->first = (DdQueueItem *)queue->first;
        queue->first = local_30;
      }
      else {
        local_30->first = queue->last[(int)item]->next;
        queue->last[(int)item]->next = (DdQueueItem *)local_30;
      }
    }
    else {
      local_30->first = queue->last[level]->next;
      queue->last[level]->next = (DdQueueItem *)local_30;
    }
    queue->last[level] = (DdQueueItem *)local_30;
    iVar1 = hashInsert(queue,(DdQueueItem *)local_30);
    if (iVar1 == 0) {
      queue_local = (DdLevelQueue *)0x0;
    }
    else {
      queue_local = local_30;
    }
  }
  return queue_local;
}

Assistant:

void *
cuddLevelQueueEnqueue(
  DdLevelQueue * queue /* level queue */,
  void * key /* key to be enqueued */,
  int  level /* level at which to insert */)
{
    int plevel;
    DdQueueItem *item;

#ifdef DD_DEBUG
    assert(level < queue->levels);
#endif
    /* Check whether entry for this node exists. */
    item = hashLookup(queue,key);
    if (item != NULL) return(item);

    /* Get a free item from either the free list or the memory manager. */
    if (queue->freelist == NULL) {
        item = (DdQueueItem *) ABC_ALLOC(char, queue->itemsize);
        if (item == NULL)
            return(NULL);
    } else {
        item = queue->freelist;
        queue->freelist = item->next;
    }
    /* Initialize. */
    memset(item, 0, queue->itemsize);
    item->key = key;
    /* Update stats. */
    queue->size++;

    if (queue->last[level]) {
        /* There are already items for this level in the queue. */
        item->next = queue->last[level]->next;
        queue->last[level]->next = item;
    } else {
        /* There are no items at the current level.  Look for the first
        ** non-empty level preceeding this one. */
        plevel = level;
        while (plevel != 0 && queue->last[plevel] == NULL)
            plevel--;
        if (queue->last[plevel] == NULL) {
            /* No element precedes this one in the queue. */
            item->next = (DdQueueItem *) queue->first;
            queue->first = item;
        } else {
            item->next = queue->last[plevel]->next;
            queue->last[plevel]->next = item;
        }
    }
    queue->last[level] = item;

    /* Insert entry for the key in the hash table. */
    if (hashInsert(queue,item) == 0) {
        return(NULL);
    }
    return(item);

}